

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O0

int error_case_tests(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  test_scope *scope;
  int ret;
  
  uVar1 = test_json(&Monster,"{ \"nickname\": \"Monster\" }",(char *)0x0,0xd,0,0,0x120);
  uVar2 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"test_type\": \"Monster\", \"test\": { \"nickname\": \"Joker\", \"color\": \"Red\" } } }"
                    ,(char *)0x0,0xd,0,0,0x122);
  uVar3 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"test_type\": \"Monster\", \"test\": { \"name\": \"Joker\", \"colour\": \"Red\" } } }"
                    ,(char *)0x0,0xd,0,0,0x124);
  uVar4 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testarrayoftables\": [ { \"nickname\": \"Joker\", \"color\": \"Red\" } ] }"
                    ,(char *)0x0,0xd,0,0,0x126);
  uVar5 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testarrayoftables\": [ { \"name\": \"Joker\", \"colour\": \"Red\" } ] }"
                    ,(char *)0x0,0xd,0,0,0x128);
  uVar6 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testarrayoftables\": [{ \"name\": \"Joker\", \"color\": \"Red\", \"test_type\": \"Monster\", \"test\": { \"nickname\": \"Harley\", \"color\": \"Blue\" } } ] }"
                    ,(char *)0x0,0xd,0,0,299);
  uVar7 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testarrayoftables\": [{ \"name\": \"Joker\", \"color\": \"Red\", \"test_type\": \"Monster\", \"test\": { \"name\": \"Harley\", \"colour\": \"Blue\" } } ] }"
                    ,(char *)0x0,0xd,0,0,0x12e);
  uVar8 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testarrayoftables\": [{ \"name\": \"Joker\", \"test_type\": \"Monster\", \"test\": { \"nickname\": \"Harley\" } },{ \"name\": \"Bonnie\", \"test_type\": \"Monster\", \"test\": { \"name\": \"Clyde\" } } ] }"
                    ,(char *)0x0,0xd,0,0,0x132);
  uVar9 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testarrayoftables\": [{ \"name\": \"Joker\", \"test_type\": \"Monster\", \"test\": { \"name\": \"Harley\" } },{ \"name\": \"Bonnie\", \"test_type\": \"Monster\", \"test\": { \"nickname\": \"Clyde\" } } ] }"
                    ,(char *)0x0,0xd,0,0,0x136);
  uVar10 = test_json(&Monster,"{ nickname: \"Monster\" }",(char *)0x0,0xd,0,0,0x145);
  uVar11 = test_json(&Monster,
                     "{ name: \"Monster\", test_type: Monster, test: { nickname: \"Joker\", color: \"Red\" } } }"
                     ,(char *)0x0,0xd,0,0,0x147);
  uVar12 = test_json(&Monster,
                     "{ name: \"Monster\", test_type: Monster, test: { name: \"Joker\", colour: \"Red\" } } }"
                     ,(char *)0x0,0xd,0,0,0x149);
  uVar13 = test_json(&Monster,
                     "{ name: \"Monster\", testarrayoftables: [ { nickname: \"Joker\", color: \"Red\" } ] }"
                     ,(char *)0x0,0xd,0,0,0x14b);
  uVar14 = test_json(&Monster,
                     "{ name: \"Monster\", testarrayoftables: [ { name: \"Joker\", colour: \"Red\" } ] }"
                     ,(char *)0x0,0xd,0,0,0x14d);
  uVar15 = test_json(&Monster,
                     "{ name: \"Monster\", testarrayoftables: [{ name: \"Joker\", color: \"Red\", test_type: Monster, test: { nickname: \"Harley\", color: \"Blue\" } } ] }"
                     ,(char *)0x0,0xd,0,0,0x150);
  uVar16 = test_json(&Monster,
                     "{ name: \"Monster\", testarrayoftables: [{ name: \"Joker\", color: \"Red\", test_type: Monster, test: { name: \"Harley\", colour: \"Blue\" } } ] }"
                     ,(char *)0x0,0xd,0,0,0x153);
  uVar17 = test_json(&Monster,
                     "{ name: \"Monster\", testarrayoftables: [{ name: \"Joker\", test_type: Monster, test: { nickname: \"Harley\" } },{ name: \"Bonnie\", test_type: Monster, test: { name: \"Clyde\" } } ] }"
                     ,(char *)0x0,0xd,0,0,0x157);
  uVar18 = test_json(&Monster,
                     "{ name: \"Monster\", testarrayoftables: [{ name: \"Joker\", test_type: Monster, test: { name: \"Harley\" } },{ name: \"Bonnie\", test_type: Monster, test: { nickname: \"Clyde\" } } ] }"
                     ,(char *)0x0,0xd,0,0,0x15b);
  return uVar18 | uVar17 | uVar16 | uVar15 | uVar14 | uVar13 | uVar12 | uVar11 | uVar10 | uVar9 | 
                                                  uVar8 | uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | 
                                                  uVar2 | uVar1;
}

Assistant:

int error_case_tests(void)
{
    BEGIN_TEST(Monster);

    TEST_ERROR( "{ \"nickname\": \"Monster\" }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ \"name\": \"Monster\", \"test_type\": \"Monster\", \"test\": { \"nickname\": \"Joker\", \"color\": \"Red\" } } }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ \"name\": \"Monster\", \"test_type\": \"Monster\", \"test\": { \"name\": \"Joker\", \"colour\": \"Red\" } } }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ \"name\": \"Monster\", \"testarrayoftables\": [ { \"nickname\": \"Joker\", \"color\": \"Red\" } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ \"name\": \"Monster\", \"testarrayoftables\": [ { \"name\": \"Joker\", \"colour\": \"Red\" } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ \"name\": \"Monster\", \"testarrayoftables\": ["
                "{ \"name\": \"Joker\", \"color\": \"Red\", \"test_type\": \"Monster\", \"test\": { \"nickname\": \"Harley\", \"color\": \"Blue\" } } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ \"name\": \"Monster\", \"testarrayoftables\": ["
                "{ \"name\": \"Joker\", \"color\": \"Red\", \"test_type\": \"Monster\", \"test\": { \"name\": \"Harley\", \"colour\": \"Blue\" } } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ \"name\": \"Monster\", \"testarrayoftables\": ["
                "{ \"name\": \"Joker\", \"test_type\": \"Monster\", \"test\": { \"nickname\": \"Harley\" } },"
                "{ \"name\": \"Bonnie\", \"test_type\": \"Monster\", \"test\": { \"name\": \"Clyde\" } } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ \"name\": \"Monster\", \"testarrayoftables\": ["
                "{ \"name\": \"Joker\", \"test_type\": \"Monster\", \"test\": { \"name\": \"Harley\" } },"
                "{ \"name\": \"Bonnie\", \"test_type\": \"Monster\", \"test\": { \"nickname\": \"Clyde\" } } ] }",
                flatcc_json_parser_error_unknown_symbol );

#if !UQ
    TEST_ERROR( "{ nickname: \"Monster\" }",
                flatcc_json_parser_error_unexpected_character );

    TEST_ERROR( "{ \"name\": \"Monster\", \"color\": Green }",
                flatcc_json_parser_error_unexpected_character );

    TEST_ERROR( "{ \"name\": \"Monster\", \"color\":    Green  Red   Blue    }",
                flatcc_json_parser_error_unexpected_character );
#endif

#if UQ
    TEST_ERROR( "{ nickname: \"Monster\" }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ name: \"Monster\", test_type: Monster, test: { nickname: \"Joker\", color: \"Red\" } } }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ name: \"Monster\", test_type: Monster, test: { name: \"Joker\", colour: \"Red\" } } }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ name: \"Monster\", testarrayoftables: [ { nickname: \"Joker\", color: \"Red\" } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ name: \"Monster\", testarrayoftables: [ { name: \"Joker\", colour: \"Red\" } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ name: \"Monster\", testarrayoftables: ["
                "{ name: \"Joker\", color: \"Red\", test_type: Monster, test: { nickname: \"Harley\", color: \"Blue\" } } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ name: \"Monster\", testarrayoftables: ["
                "{ name: \"Joker\", color: \"Red\", test_type: Monster, test: { name: \"Harley\", colour: \"Blue\" } } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ name: \"Monster\", testarrayoftables: ["
                "{ name: \"Joker\", test_type: Monster, test: { nickname: \"Harley\" } },"
                "{ name: \"Bonnie\", test_type: Monster, test: { name: \"Clyde\" } } ] }",
                flatcc_json_parser_error_unknown_symbol );
    TEST_ERROR( "{ name: \"Monster\", testarrayoftables: ["
                "{ name: \"Joker\", test_type: Monster, test: { name: \"Harley\" } },"
                "{ name: \"Bonnie\", test_type: Monster, test: { nickname: \"Clyde\" } } ] }",
                flatcc_json_parser_error_unknown_symbol );

#endif

    END_TEST();
}